

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O1

int xio_send(XIO_HANDLE xio,void *buffer,size_t size,ON_SEND_COMPLETE on_send_complete,
            void *callback_context)

{
  int iVar1;
  
  if (xio != (XIO_HANDLE)0x0) {
    iVar1 = (*xio->io_interface_description->concrete_io_send)
                      (xio->concrete_xio_handle,buffer,size,on_send_complete,callback_context);
    return iVar1;
  }
  return 0x8c;
}

Assistant:

int xio_send(XIO_HANDLE xio, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    /* Codes_SRS_XIO_01_011: [No error check shall be performed on buffer and size.] */
    /* Codes_SRS_XIO_01_010: [If handle is NULL, xio_send shall return a non-zero value.] */
    if (xio == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;

        /* Codes_SRS_XIO_01_008: [xio_send shall pass the sequence of bytes pointed to by buffer to the concrete IO implementation specified in xio_create, by calling the concrete_io_send function while passing down the buffer and size arguments to it.] */
        /* Codes_SRS_XIO_01_009: [On success, xio_send shall return 0.] */
        /* Codes_SRS_XIO_01_015: [If the underlying concrete_io_send fails, xio_send shall return a non-zero value.] */
        /* Codes_SRS_XIO_01_027: [xio_send shall pass to the concrete_io_send function the on_send_complete and callback_context arguments.] */
        result = xio_instance->io_interface_description->concrete_io_send(xio_instance->concrete_xio_handle, buffer, size, on_send_complete, callback_context);
    }

    return result;
}